

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O2

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  uint uVar1;
  undefined4 extraout_EAX;
  int iVar2;
  long lVar3;
  size_t outlen;
  size_t outlen_00;
  secp256k1_gej *psVar4;
  secp256k1_gej *psVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  size_t sStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  secp256k1_scalar local_140;
  secp256k1_fe s;
  secp256k1_rfc6979_hmac_sha256 local_f4;
  secp256k1_gej gb;
  
  bVar6 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  if (seed32 == (uchar *)0x0) {
    (ctx->initial).infinity = 0;
    (ctx->initial).x.n[0] = 0x2815b16f81798;
    (ctx->initial).x.n[1] = 0xdb2dce28d959f;
    (ctx->initial).x.n[2] = 0xe870b07029bfc;
    (ctx->initial).x.n[3] = 0xbbac55a06295c;
    (ctx->initial).x.n[4] = 0x79be667ef9dc;
    (ctx->initial).y.n[0] = 0x7d08ffb10d4b8;
    (ctx->initial).y.n[1] = 0x48a68554199c4;
    (ctx->initial).y.n[2] = 0xe1108a8fd17b4;
    (ctx->initial).y.n[3] = 0xc4655da4fbfc0;
    (ctx->initial).y.n[4] = 0x483ada7726a3;
    (ctx->initial).z.n[0] = 1;
    (ctx->initial).z.n[1] = 0;
    (ctx->initial).z.n[2] = 0;
    (ctx->initial).z.n[3] = 0;
    (ctx->initial).z.n[4] = 0;
    secp256k1_gej_neg(&ctx->initial,&ctx->initial);
    (ctx->blind).d[0] = 1;
    (ctx->blind).d[1] = 0;
    (ctx->blind).d[2] = 0;
    (ctx->blind).d[3] = 0;
  }
  secp256k1_scalar_get_b32((uchar *)&local_168,&ctx->blind);
  local_198 = local_158;
  uStack_190 = uStack_150;
  local_1a8 = local_168;
  uStack_1a0 = uStack_160;
  if (seed32 == (uchar *)0x0) {
    sStack_1b0 = 0x20;
  }
  else {
    local_188 = *(undefined8 *)seed32;
    uStack_180 = *(undefined8 *)(seed32 + 8);
    local_178 = *(undefined8 *)(seed32 + 0x10);
    uStack_170 = *(undefined8 *)(seed32 + 0x18);
    sStack_1b0 = 0x40;
  }
  secp256k1_rfc6979_hmac_sha256_initialize(&local_f4,(uchar *)&local_1a8,sStack_1b0);
  secp256k1_rfc6979_hmac_sha256_generate(&local_f4,(uchar *)&local_168,outlen);
  uVar1 = secp256k1_fe_set_b32(&s,(uchar *)&local_168);
  secp256k1_fe_cmov(&s,&secp256k1_fe_one,
                    (uint)(((s.n[3] == 0 && s.n[1] == 0) && (s.n[2] == 0 && s.n[0] == 0)) &&
                          s.n[4] == 0) | uVar1 ^ 1);
  secp256k1_gej_rescale(&ctx->initial,&s);
  secp256k1_fe_clear(&s);
  secp256k1_rfc6979_hmac_sha256_generate(&local_f4,(uchar *)&local_168,outlen_00);
  secp256k1_scalar_set_b32(&local_140,(uchar *)&local_168,(int *)0x0);
  auVar7._0_4_ = -(uint)((int)local_140.d[2] == 0 && (int)local_140.d[0] == 0);
  auVar7._4_4_ = -(uint)(local_140.d[2]._4_4_ == 0 && local_140.d[0]._4_4_ == 0);
  auVar7._8_4_ = -(uint)((int)local_140.d[3] == 0 && (int)local_140.d[1] == 0);
  auVar7._12_4_ = -(uint)(local_140.d[3]._4_4_ == 0 && local_140.d[1]._4_4_ == 0);
  iVar2 = movmskps(extraout_EAX,auVar7);
  secp256k1_scalar_cmov(&local_140,&secp256k1_scalar_one,(uint)(iVar2 == 0xf));
  secp256k1_ecmult_gen(ctx,&gb,&local_140);
  secp256k1_scalar_negate(&local_140,&local_140);
  (ctx->blind).d[2] = CONCAT44(local_140.d[2]._4_4_,(int)local_140.d[2]);
  (ctx->blind).d[3] = CONCAT44(local_140.d[3]._4_4_,(int)local_140.d[3]);
  (ctx->blind).d[0] = CONCAT44(local_140.d[0]._4_4_,(int)local_140.d[0]);
  (ctx->blind).d[1] = CONCAT44(local_140.d[1]._4_4_,(int)local_140.d[1]);
  psVar4 = &gb;
  psVar5 = &ctx->initial;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (psVar5->x).n[0] = (psVar4->x).n[0];
    psVar4 = (secp256k1_gej *)((long)psVar4 + (ulong)bVar6 * -0x10 + 8);
    psVar5 = (secp256k1_gej *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  secp256k1_gej_clear(&gb);
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_gej gb;
    secp256k1_fe s;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    int overflow;
    unsigned char keydata[64] = {0};
    if (seed32 == NULL) {
        /* When seed is NULL, reset the initial point and blinding value. */
        secp256k1_gej_set_ge(&ctx->initial, &secp256k1_ge_const_g);
        secp256k1_gej_neg(&ctx->initial, &ctx->initial);
        secp256k1_scalar_set_int(&ctx->blind, 1);
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(nonce32, &ctx->blind);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    memcpy(keydata, nonce32, 32);
    if (seed32 != NULL) {
        memcpy(keydata + 32, seed32, 32);
    }
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, seed32 ? 64 : 32);
    memset(keydata, 0, sizeof(keydata));
    /* Accept unobservably small non-uniformity. */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    overflow = !secp256k1_fe_set_b32(&s, nonce32);
    overflow |= secp256k1_fe_is_zero(&s);
    secp256k1_fe_cmov(&s, &secp256k1_fe_one, overflow);
    /* Randomize the projection to defend against multiplier sidechannels. */
    secp256k1_gej_rescale(&ctx->initial, &s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* A blinding value of 0 works, but would undermine the projection hardening. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    ctx->blind = b;
    ctx->initial = gb;
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
}